

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visitObject(PostResolutionChecks *this,Statement *t)

{
  char cVar1;
  long *plVar2;
  CompileMessage CStack_88;
  CompileMessage local_50;
  
  plVar2 = (long *)__dynamic_cast(t,&AST::Statement::typeinfo,&AST::Expression::typeinfo,0);
  if (plVar2 != (long *)0x0) {
    if ((int)plVar2[5] == 1) {
      cVar1 = (**(code **)(*plVar2 + 0x18))(plVar2);
      if (cVar1 != '\0') {
        CompileMessageHelpers::createMessage<>(&local_50,syntax,error,"Expected a statement");
        AST::Context::throwError(&(t->super_ASTObject).context,&local_50,false);
      }
    }
    cVar1 = (**(code **)(*plVar2 + 0x70))(plVar2);
    if (cVar1 != '\0') {
      CompileMessageHelpers::createMessage<>
                (&CStack_88,syntax,error,"This constant expression will have no effect");
      AST::Context::throwError(&(t->super_ASTObject).context,&CStack_88,false);
    }
  }
  ASTVisitor::visitObject(&this->super_ASTVisitor,t);
  return;
}

Assistant:

void visitObject (AST::Statement& t) override
        {
            if (auto e = cast<AST::Expression> (t))
            {
                if (AST::isResolvedAsType (e))
                    t.context.throwError (Errors::expectedStatement());

                if (e->isCompileTimeConstant())
                    t.context.throwError (Errors::expressionHasNoEffect());
            }

            super::visitObject (t);
        }